

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

int hd_read_byte(hd_context *ctx,hd_stream *stm)

{
  byte *pbVar1;
  hd_error_stack_slot *phVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  pbVar1 = stm->rp;
  if (pbVar1 == stm->wp) {
    iVar3 = hd_push_try(ctx);
    iVar4 = -1;
    if ((iVar3 != 0) && (iVar3 = __sigsetjmp(ctx->error->top->buffer,0), iVar3 == 0)) {
      iVar4 = (*stm->next)(ctx,stm,1);
    }
    phVar2 = ctx->error->top;
    ctx->error->top = phVar2 + -1;
    if (phVar2->code < 2) {
      if (iVar4 != -1) {
        return iVar4;
      }
    }
    else {
      hd_rethrow_if(ctx,4);
      hd_warn(ctx,"read error; treating as end of file");
      stm->error = 1;
    }
    stm->eof = 1;
    uVar5 = 0xffffffff;
  }
  else {
    stm->rp = pbVar1 + 1;
    uVar5 = (uint)*pbVar1;
  }
  return uVar5;
}

Assistant:

static inline int hd_read_byte(hd_context *ctx, hd_stream *stm)
{
    int c = EOF;

    if (stm->rp != stm->wp)
        return *stm->rp++;
    hd_try(ctx)
    {
        c = stm->next(ctx, stm, 1);
    }
    hd_catch(ctx)
    {
        hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
        hd_warn(ctx, "read error; treating as end of file");
        stm->error = 1;
        c = EOF;
    }
    if (c == EOF)
        stm->eof = 1;
    return c;
}